

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_trim_completeString_fn(int _i)

{
  char *pcVar1;
  char *expr;
  int line;
  char *pcVar2;
  char *pcVar3;
  AString string;
  
  private_ACUtilsTest_AString_constructTestString(&string,"        ",8);
  private_ACUtilsTest_AString_reallocFail = 0;
  AString_trim(&string,' ');
  if (string.capacity == 8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x222);
    if (string.buffer == (char *)0x0) {
      string.size = 0;
      string.buffer = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar1 = "Assertion \'%s\' failed: %s == %#x";
      pcVar2 = "(void*) (string).buffer != NULL";
      pcVar3 = "(void*) (string).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x222);
      if (string.buffer == (char *)0x0) {
        string.buffer = "(null)";
        string.size = 0x16819b;
      }
      else {
        if (*string.buffer == '\0') {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x222);
          if (string.size == 0) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x222);
            if (private_ACUtilsTest_AString_reallocCount == 0) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x223);
              (*string.deallocator)(string.buffer);
              return;
            }
            string.buffer = "(0)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar1 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar2 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar3 = "private_ACUtilsTest_AString_reallocCount";
            line = 0x223;
            string.size = private_ACUtilsTest_AString_reallocCount;
            goto LAB_0012473f;
          }
          string.buffer = "strlen(\"\")";
          expr = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar1 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar2 = "(string).size == strlen(\"\")";
          pcVar3 = "(string).size";
          goto LAB_0012473a;
        }
        string.size = 0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar1 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar2 = "(string).buffer == (\"\")";
      pcVar3 = "(string).buffer";
    }
  }
  else {
    string.buffer = "(8)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar1 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar2 = "(string).capacity == (8)";
    pcVar3 = "(string).capacity";
    string.size = string.capacity;
  }
LAB_0012473a:
  line = 0x222;
LAB_0012473f:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,line,expr,pcVar1,pcVar2,pcVar3,string.size,string.buffer);
}

Assistant:

END_TEST
START_TEST(test_AString_trim_completeString)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("        ", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    AString_trim(&string, ' ');
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}